

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_re_match(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  lysc_pattern **patterns;
  int iVar1;
  lyxp_set *plVar2;
  ly_bool lVar3;
  LY_ERR ret___1;
  LY_ERR LVar4;
  long *__ptr;
  char *pcVar5;
  void *pvVar6;
  size_t str_len;
  uint32_t uVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  LY_ERR ret__;
  undefined4 uVar11;
  ly_ctx *plVar12;
  ushort *puVar13;
  ly_err_item *err;
  ly_err_item *local_38;
  
  plVar2 = *args;
  if ((options & 0x1c) == 0) {
    LVar4 = lyxp_set_cast(plVar2,LYXP_SET_STRING);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    LVar4 = lyxp_set_cast(args[1],LYXP_SET_STRING);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    __ptr = (long *)malloc(0x10);
    if (__ptr == (long *)0x0) {
      ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_re_match");
      return LY_EMEM;
    }
    *__ptr = 1;
    patterns = (lysc_pattern **)(__ptr + 1);
    lVar10 = *__ptr;
    __ptr[lVar10] = 0;
    pvVar6 = calloc(1,0x40);
    __ptr[lVar10] = (long)pvVar6;
    if ((set->field_10).cur_node != (lyd_node *)0x0) {
      ly_log_location((lysc_node *)0x0,(set->field_10).cur_node,(char *)0x0,(ly_in *)0x0);
    }
    LVar4 = lys_compile_type_pattern_check
                      (set->ctx,(args[1]->val).str,(pcre2_code_8 **)(__ptr[lVar10] + 8));
    if ((set->field_10).cur_node != (lyd_node *)0x0) {
      ly_log_location_revert(0,1,0,0);
    }
    if (LVar4 == LY_SUCCESS) {
      pcVar5 = ((*args)->val).str;
      str_len = strlen(pcVar5);
      LVar4 = lyplg_type_validate_patterns(patterns,pcVar5,str_len,&local_38);
      pcre2_code_free_8(*(undefined8 *)(__ptr[lVar10] + 8));
      free((void *)__ptr[lVar10]);
      if (patterns != (lysc_pattern **)0x0) {
        free(__ptr);
      }
      if (LVar4 != LY_SUCCESS) {
        if (LVar4 == LY_EVALID) {
          ly_err_free(local_38);
          lyxp_set_free_content(set);
          set->type = LYXP_SET_BOOLEAN;
          (set->val).bln = '\0';
          return LY_SUCCESS;
        }
        ly_err_print(set->ctx,local_38);
        ly_err_free(local_38);
        return LVar4;
      }
      lyxp_set_free_content(set);
      set->type = LYXP_SET_BOOLEAN;
      (set->val).bln = '\x01';
      return LY_SUCCESS;
    }
    if (patterns != (lysc_pattern **)0x0) {
      free(__ptr);
      return LVar4;
    }
    return LVar4;
  }
  if (plVar2->type == LYXP_SET_SCNODE_SET) {
    uVar7 = plVar2->used;
    puVar13 = (ushort *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar7 * 0x18 + 0xc) == 2) {
        puVar13 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar7 * 0x18);
        break;
      }
    } while (uVar7 != 0);
    if (puVar13 != (ushort *)0x0) {
      if ((*puVar13 & 0xc) == 0) {
        plVar12 = set->ctx;
        pcVar5 = lys_nodetype2str(*puVar13);
        pcVar9 = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        lVar3 = warn_is_string_type(*(lysc_type **)(puVar13 + 0x30));
        if (lVar3 != '\0') goto LAB_001b6149;
        plVar12 = set->ctx;
        pcVar5 = *(char **)(puVar13 + 0x14);
        pcVar9 = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      ly_log(plVar12,LY_LLWRN,LY_SUCCESS,pcVar9,"xpath_re_match",pcVar5);
    }
  }
LAB_001b6149:
  plVar2 = args[1];
  if (plVar2->type == LYXP_SET_SCNODE_SET) {
    uVar8 = plVar2->used;
    puVar13 = (ushort *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
        puVar13 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18);
        break;
      }
    } while (uVar8 != 0);
    if (puVar13 != (ushort *)0x0) {
      if ((*puVar13 & 0xc) == 0) {
        plVar12 = set->ctx;
        pcVar5 = lys_nodetype2str(*puVar13);
        pcVar9 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        lVar3 = warn_is_string_type(*(lysc_type **)(puVar13 + 0x30));
        if (lVar3 != '\0') goto LAB_001b61ec;
        plVar12 = set->ctx;
        pcVar5 = *(char **)(puVar13 + 0x14);
        pcVar9 = "Argument #2 of %s is node \"%s\", not of string-type.";
      }
      ly_log(plVar12,LY_LLWRN,LY_SUCCESS,pcVar9,"xpath_re_match",pcVar5);
    }
  }
LAB_001b61ec:
  uVar8 = set->used;
  if ((ulong)uVar8 != 0) {
    lVar10 = 0;
    do {
      iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar10);
      if (iVar1 == 2) {
        uVar11 = 1;
LAB_001b621c:
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = uVar11;
      }
      else if (iVar1 == -2) {
        uVar11 = 0xffffffff;
        goto LAB_001b621c;
      }
      lVar10 = lVar10 + 0x18;
    } while ((ulong)uVar8 * 0x18 != lVar10);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_re_match(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lysc_pattern **patterns = NULL, **pattern;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;
    struct ly_err_item *err;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    LY_ARRAY_NEW_RET(set->ctx, patterns, pattern, LY_EMEM);
    *pattern = calloc(1, sizeof **pattern);
    if (set->cur_node) {
        LOG_LOCSET(NULL, set->cur_node);
    }
    rc = lys_compile_type_pattern_check(set->ctx, args[1]->val.str, &(*pattern)->code);
    if (set->cur_node) {
        LOG_LOCBACK(0, 1);
    }
    if (rc != LY_SUCCESS) {
        LY_ARRAY_FREE(patterns);
        return rc;
    }

    rc = lyplg_type_validate_patterns(patterns, args[0]->val.str, strlen(args[0]->val.str), &err);
    pcre2_code_free((*pattern)->code);
    free(*pattern);
    LY_ARRAY_FREE(patterns);
    if (rc && (rc != LY_EVALID)) {
        ly_err_print(set->ctx, err);
        ly_err_free(err);
        return rc;
    }

    if (rc == LY_EVALID) {
        ly_err_free(err);
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return LY_SUCCESS;
}